

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_dstr.c
# Opt level: O0

void arg_dstr_free(arg_dstr_t ds)

{
  arg_dstr_t ds_local;
  
  if (ds->free_proc != (arg_dstr_freefn *)0x0) {
    if (ds->free_proc == (arg_dstr_freefn *)0x3) {
      argtable3_xfree(ds->data);
    }
    else {
      (*ds->free_proc)(ds->data);
    }
    ds->free_proc = (arg_dstr_freefn *)0x0;
  }
  return;
}

Assistant:

void arg_dstr_free(arg_dstr_t ds) {
    if (ds->free_proc != NULL) {
        if (ds->free_proc == ARG_DSTR_DYNAMIC) {
            xfree(ds->data);
        } else {
            (*ds->free_proc)(ds->data);
        }
        ds->free_proc = NULL;
    }
}